

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O2

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,string *filename)

{
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((string *)&out,(_Ios_Openmode)filename);
  Write(this,(ostream *)&out);
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void SoundFontWriter::Write(const std::string & filename) {
  std::ofstream out;

  out.exceptions(std::ios::badbit | std::ios::failbit);
  out.open(filename, std::ios::binary);

  Write(out);
}